

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfa.cc
# Opt level: O1

void __thiscall duckdb_re2::NFA::~NFA(NFA *this)

{
  _Elt_pointer pTVar1;
  AddState *pAVar2;
  _Elt_pointer pTVar3;
  Thread *t;
  _Elt_pointer pTVar4;
  _Map_pointer ppTVar5;
  
  if (this->match_ != (char **)0x0) {
    operator_delete__(this->match_);
  }
  pTVar4 = (this->arena_).
           super__Deque_base<duckdb_re2::NFA::Thread,_std::allocator<duckdb_re2::NFA::Thread>_>.
           _M_impl.super__Deque_impl_data._M_start._M_cur;
  pTVar1 = (this->arena_).
           super__Deque_base<duckdb_re2::NFA::Thread,_std::allocator<duckdb_re2::NFA::Thread>_>.
           _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pTVar4 != pTVar1) {
    pTVar3 = (this->arena_).
             super__Deque_base<duckdb_re2::NFA::Thread,_std::allocator<duckdb_re2::NFA::Thread>_>.
             _M_impl.super__Deque_impl_data._M_start._M_last;
    ppTVar5 = (this->arena_).
              super__Deque_base<duckdb_re2::NFA::Thread,_std::allocator<duckdb_re2::NFA::Thread>_>.
              _M_impl.super__Deque_impl_data._M_start._M_node;
    do {
      if (pTVar4->capture != (char **)0x0) {
        operator_delete__(pTVar4->capture);
      }
      pTVar4 = pTVar4 + 1;
      if (pTVar4 == pTVar3) {
        pTVar4 = ppTVar5[1];
        ppTVar5 = ppTVar5 + 1;
        pTVar3 = pTVar4 + 0x20;
      }
    } while (pTVar4 != pTVar1);
  }
  std::_Deque_base<duckdb_re2::NFA::Thread,_std::allocator<duckdb_re2::NFA::Thread>_>::~_Deque_base
            (&(this->arena_).
              super__Deque_base<duckdb_re2::NFA::Thread,_std::allocator<duckdb_re2::NFA::Thread>_>);
  pAVar2 = (this->stack_).ptr_._M_t.
           super___uniq_ptr_impl<duckdb_re2::NFA::AddState,_duckdb_re2::PODArray<duckdb_re2::NFA::AddState>::Deleter>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb_re2::NFA::AddState_*,_duckdb_re2::PODArray<duckdb_re2::NFA::AddState>::Deleter>
           .super__Head_base<0UL,_duckdb_re2::NFA::AddState_*,_false>._M_head_impl;
  if (pAVar2 != (AddState *)0x0) {
    operator_delete(pAVar2);
  }
  (this->stack_).ptr_._M_t.
  super___uniq_ptr_impl<duckdb_re2::NFA::AddState,_duckdb_re2::PODArray<duckdb_re2::NFA::AddState>::Deleter>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb_re2::NFA::AddState_*,_duckdb_re2::PODArray<duckdb_re2::NFA::AddState>::Deleter>
  .super__Head_base<0UL,_duckdb_re2::NFA::AddState_*,_false>._M_head_impl = (AddState *)0x0;
  SparseArray<duckdb_re2::NFA::Thread_*>::~SparseArray(&this->q1_);
  SparseArray<duckdb_re2::NFA::Thread_*>::~SparseArray(&this->q0_);
  return;
}

Assistant:

NFA::~NFA() {
  delete[] match_;
  for (const Thread& t : arena_)
    delete[] t.capture;
}